

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_replay.cpp
# Opt level: O0

bool parse_json_stats(string *foz_path,Document *doc)

{
  ResourceTag RVar1;
  undefined8 uVar2;
  pointer __n;
  unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_> this;
  bool bVar3;
  uint uVar4;
  char *pcVar5;
  DatabaseInterface *__p;
  pointer pDVar6;
  Ch *str;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *pMVar7;
  undefined1 local_140 [8];
  Value v;
  value_type_conflict1 local_119;
  size_type local_118;
  size_t json_size;
  Document tmp_doc;
  unsigned_long *hash;
  iterator __end2;
  iterator __begin2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range2;
  undefined1 local_88 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> hashes;
  size_t num_hashes;
  ResourceTag *tag;
  ResourceTag *__end1;
  ResourceTag *__begin1;
  ResourceTag (*__range1) [3];
  vector<char,_std::allocator<char>_> json_buffer;
  unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
  local_28;
  unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_> db;
  Document *doc_local;
  string *foz_path_local;
  
  db._M_t.
  super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
  ._M_t.
  super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
  .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl =
       (__uniq_ptr_data<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>,_true,_true>
        )(__uniq_ptr_data<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>,_true,_true>
          )doc;
  pcVar5 = (char *)std::__cxx11::string::c_str();
  __p = Fossilize::create_stream_archive_database(pcVar5,ReadOnly);
  std::unique_ptr<Fossilize::DatabaseInterface,std::default_delete<Fossilize::DatabaseInterface>>::
  unique_ptr<std::default_delete<Fossilize::DatabaseInterface>,void>
            ((unique_ptr<Fossilize::DatabaseInterface,std::default_delete<Fossilize::DatabaseInterface>>
              *)&local_28,__p);
  bVar3 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_28);
  if (bVar3) {
    pDVar6 = std::
             unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
             ::operator->(&local_28);
    uVar4 = (*pDVar6->_vptr_DatabaseInterface[2])();
    if ((uVar4 & 1) == 0) {
      foz_path_local._7_1_ = 0;
      json_buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ = 1;
    }
    else {
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::SetArray((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)db._M_t.
                    super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
                    .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl);
      std::vector<char,_std::allocator<char>_>::vector
                ((vector<char,_std::allocator<char>_> *)&__range1);
      for (__end1 = parse_json_stats::stat_tags; __end1 != (ResourceTag *)"Z4mainE3$_0";
          __end1 = __end1 + 1) {
        hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pDVar6 = std::
                 unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                 ::operator->(&local_28);
        uVar4 = (*pDVar6->_vptr_DatabaseInterface[6])
                          (pDVar6,(ulong)*__end1,
                           &hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
        __n = hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
        if ((uVar4 & 1) == 0) {
          foz_path_local._7_1_ = 0;
          json_buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ = 1;
          goto LAB_001346eb;
        }
        std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)((long)&__range2 + 7));
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_88,(size_type)__n,
                   (allocator_type *)((long)&__range2 + 7));
        std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)((long)&__range2 + 7))
        ;
        pDVar6 = std::
                 unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                 ::operator->(&local_28);
        RVar1 = *__end1;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_88);
        uVar4 = (*pDVar6->_vptr_DatabaseInterface[6])
                          (pDVar6,(ulong)RVar1,
                           &hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        if ((uVar4 & 1) == 0) {
          foz_path_local._7_1_ = 0;
          json_buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ = 1;
        }
        else {
          __end2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                             ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_88);
          hash = (unsigned_long *)
                 std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_88);
          while (bVar3 = __gnu_cxx::operator!=
                                   (&__end2,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                             *)&hash), bVar3) {
            tmp_doc.parseResult_.offset_ =
                 (size_t)__gnu_cxx::
                         __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                         ::operator*(&__end2);
            rapidjson::
            GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
            ::GenericDocument((GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                               *)&json_size,(MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x0,
                              0x400,(CrtAllocator *)0x0);
            local_118 = 0;
            pDVar6 = std::
                     unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                     ::operator->(&local_28);
            uVar4 = (*pDVar6->_vptr_DatabaseInterface[3])
                              (pDVar6,(ulong)*__end1,*(undefined8 *)tmp_doc.parseResult_.offset_,
                               &local_118,0,0);
            if ((uVar4 & 1) == 0) {
              json_buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ = 5;
            }
            else {
              std::vector<char,_std::allocator<char>_>::resize
                        ((vector<char,_std::allocator<char>_> *)&__range1,local_118);
              pDVar6 = std::
                       unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                       ::operator->(&local_28);
              RVar1 = *__end1;
              uVar2 = *(undefined8 *)tmp_doc.parseResult_.offset_;
              std::vector<char,_std::allocator<char>_>::data
                        ((vector<char,_std::allocator<char>_> *)&__range1);
              uVar4 = (*pDVar6->_vptr_DatabaseInterface[3])(pDVar6,(ulong)RVar1,uVar2);
              if ((uVar4 & 1) == 0) {
                json_buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ = 5;
              }
              else {
                local_119 = '\0';
                std::vector<char,_std::allocator<char>_>::push_back
                          ((vector<char,_std::allocator<char>_> *)&__range1,&local_119);
                pcVar5 = std::vector<char,_std::allocator<char>_>::data
                                   ((vector<char,_std::allocator<char>_> *)&__range1);
                rapidjson::StringRef<char>((rapidjson *)(v.data_.ss.str + 8),pcVar5);
                str = rapidjson::GenericStringRef::operator_cast_to_char_
                                ((GenericStringRef *)(v.data_.ss.str + 8));
                rapidjson::
                GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                ::Parse((GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                         *)&json_size,str);
                bVar3 = rapidjson::
                        GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                        ::HasParseError((GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                                         *)&json_size);
                if (bVar3) {
                  json_buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ = 5;
                }
                else {
                  rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                  *)local_140);
                  pMVar7 = rapidjson::
                           GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                           ::GetAllocator((GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                                           *)db._M_t.
                                             super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
                                             .
                                             super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>
                                             ._M_head_impl);
                  rapidjson::
                  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                  ::CopyFrom<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                            ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                              *)local_140,
                             (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                              *)&json_size,pMVar7,false);
                  this = db;
                  pMVar7 = rapidjson::
                           GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                           ::GetAllocator((GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                                           *)db._M_t.
                                             super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
                                             .
                                             super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>
                                             ._M_head_impl);
                  rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::PushBack((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                              *)this._M_t.
                                super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
                                .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>.
                                _M_head_impl,
                             (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                              *)local_140,pMVar7);
                  rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                   *)local_140);
                  json_buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ = 0;
                }
              }
            }
            rapidjson::
            GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
            ::~GenericDocument((GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                                *)&json_size);
            __gnu_cxx::
            __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
            ::operator++(&__end2);
          }
          json_buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ = 0;
        }
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_88);
        if (json_buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ != 0)
        goto LAB_001346eb;
      }
      foz_path_local._7_1_ = 1;
      json_buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ = 1;
LAB_001346eb:
      std::vector<char,_std::allocator<char>_>::~vector
                ((vector<char,_std::allocator<char>_> *)&__range1);
    }
  }
  else {
    foz_path_local._7_1_ = 0;
    json_buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ = 1;
  }
  std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
  ::~unique_ptr(&local_28);
  return (bool)(foz_path_local._7_1_ & 1);
}

Assistant:

static bool parse_json_stats(const std::string &foz_path, rapidjson::Document &doc)
{
	auto db = std::unique_ptr<DatabaseInterface>(create_stream_archive_database(foz_path.c_str(), DatabaseMode::ReadOnly));
	if (!db)
		return false;
	if (!db->prepare())
		return false;

	static const ResourceTag stat_tags[] = {
		RESOURCE_GRAPHICS_PIPELINE,
		RESOURCE_COMPUTE_PIPELINE,
		RESOURCE_RAYTRACING_PIPELINE,
	};

	doc.SetArray();

	std::vector<char> json_buffer;

	for (auto &tag : stat_tags)
	{
		size_t num_hashes = 0;
		if (!db->get_hash_list_for_resource_tag(tag, &num_hashes, nullptr))
			return false;
		std::vector<Hash> hashes(num_hashes);
		if (!db->get_hash_list_for_resource_tag(tag, &num_hashes, hashes.data()))
			return false;

		for (auto &hash : hashes)
		{
			rapidjson::Document tmp_doc;
			size_t json_size = 0;
			if (!db->read_entry(tag, hash, &json_size, nullptr, 0))
				continue;
			json_buffer.resize(json_size);
			if (!db->read_entry(tag, hash, &json_size, json_buffer.data(), 0))
				continue;
			json_buffer.push_back('\0');

			tmp_doc.Parse(rapidjson::StringRef(json_buffer.data()));
			if (tmp_doc.HasParseError())
				continue;

			rapidjson::Value v;
			v.CopyFrom(tmp_doc, doc.GetAllocator());
			doc.PushBack(v, doc.GetAllocator());
		}
	}

	return true;
}